

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepTiledBasic.cpp
# Opt level: O2

void testDeepTiledBasic(string *tempDir)

{
  int iVar1;
  ostream *poVar2;
  string *extraout_RDX;
  string *tempDir_00;
  string *tempDir_01;
  string *tempDir_02;
  string *extraout_RDX_00;
  int testTimes;
  bool bVar3;
  
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "Testing the DeepTiledInput/OutputFile for basic use");
  std::endl<char,std::char_traits<char>>(poVar2);
  random_reseed(1);
  IlmThread_3_2::ThreadPool::globalThreadPool();
  IlmThread_3_2::ThreadPool::numThreads();
  iVar1 = IlmThread_3_2::ThreadPool::globalThreadPool();
  IlmThread_3_2::ThreadPool::setNumThreads(iVar1);
  iVar1 = 4;
  tempDir_00 = extraout_RDX;
  while (bVar3 = iVar1 != 0, iVar1 = iVar1 + -1, bVar3) {
    testTimes = (int)tempDir;
    anon_unknown.dwarf_106ef0::readWriteTestWithAbsoluateCoordinates(1,testTimes,tempDir_00);
    anon_unknown.dwarf_106ef0::readWriteTestWithAbsoluateCoordinates(3,testTimes,tempDir_01);
    anon_unknown.dwarf_106ef0::readWriteTestWithAbsoluateCoordinates(10,testTimes,tempDir_02);
    tempDir_00 = extraout_RDX_00;
  }
  iVar1 = IlmThread_3_2::ThreadPool::globalThreadPool();
  IlmThread_3_2::ThreadPool::setNumThreads(iVar1);
  poVar2 = std::operator<<((ostream *)&std::cout,"ok\n");
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void
testDeepTiledBasic (const std::string& tempDir)
{
    try
    {
        cout << "Testing the DeepTiledInput/OutputFile for basic use" << endl;

        random_reseed (1);

        int numThreads = ThreadPool::globalThreadPool ().numThreads ();
        ThreadPool::globalThreadPool ().setNumThreads (2);

        for (int pass = 0; pass < 4; pass++)
        {
            readWriteTestWithAbsoluateCoordinates (1, 2, tempDir);
            readWriteTestWithAbsoluateCoordinates (3, 2, tempDir);
            readWriteTestWithAbsoluateCoordinates (10, 2, tempDir);
        }
        ThreadPool::globalThreadPool ().setNumThreads (numThreads);

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}